

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O0

type * Disa::operator*(type *__return_storage_ptr__,Matrix_Dense<double,_3UL,_3UL> *matrix,
                      Vector_Dense<double,_0UL> *vector)

{
  source_location *psVar1;
  source_location *location;
  ostream *poVar2;
  size_t sVar3;
  size_type __val;
  anon_class_16_2_64c6d03b local_180;
  function<double_(unsigned_long)> local_170;
  string local_150;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  vector<double,_std::allocator<double>_> *local_18;
  Vector_Dense<double,_0UL> *vector_local;
  Matrix_Dense<double,_3UL,_3UL> *matrix_local;
  
  local_18 = &vector->super_vector<double,_std::allocator<double>_>;
  vector_local = (Vector_Dense<double,_0UL> *)matrix;
  psVar1 = (source_location *)Matrix_Dense<double,_3UL,_3UL>::size_column(matrix);
  location = (source_location *)std::vector<double,_std::allocator<double>_>::size(local_18);
  if (psVar1 != location) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    local_40 = &PTR_s__workspace_llm4binary_github_lic_001ee0b0;
    console_format_abi_cxx11_(&local_38,(Disa *)0x0,(Log_Level)&local_40,location);
    poVar2 = std::operator<<(poVar2,(string *)&local_38);
    sVar3 = Matrix_Dense<double,_3UL,_3UL>::size_row((Matrix_Dense<double,_3UL,_3UL> *)vector_local)
    ;
    std::__cxx11::to_string(&local_110,sVar3);
    std::operator+(&local_f0,"Incompatible vector-matrix dimensions, ",&local_110);
    std::operator+(&local_d0,&local_f0,",");
    sVar3 = Matrix_Dense<double,_3UL,_3UL>::size_column
                      ((Matrix_Dense<double,_3UL,_3UL> *)vector_local);
    std::__cxx11::to_string(&local_130,sVar3);
    std::operator+(&local_b0,&local_d0,&local_130);
    std::operator+(&local_90,&local_b0," vs. ");
    __val = std::vector<double,_std::allocator<double>_>::size(local_18);
    std::__cxx11::to_string(&local_150,__val);
    std::operator+(&local_70,&local_90,&local_150);
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_38);
    exit(1);
  }
  local_180.matrix = (Matrix_Dense<double,_3UL,_3UL> *)vector_local;
  local_180.vector = (Vector_Dense<double,_0UL> *)local_18;
  std::function<double(unsigned_long)>::operator*
            ((function<double(unsigned_long)> *)&local_170,&local_180);
  sVar3 = Matrix_Dense<double,_3UL,_3UL>::size_column
                    ((Matrix_Dense<double,_3UL,_3UL> *)vector_local);
  Vector_Dense<double,_3UL>::Vector_Dense(__return_storage_ptr__,&local_170,sVar3);
  std::function<double_(unsigned_long)>::~function(&local_170);
  return __return_storage_ptr__;
}

Assistant:

typename Static_Promoter<Vector_Dense<_type, _row>, Vector_Dense<_type, _size>>::type constexpr operator*(
const Matrix_Dense<_type, _row, _col>& matrix, const Vector_Dense<_type, _size>& vector) {
  ASSERT_DEBUG(matrix.size_column() == vector.size(),
               "Incompatible vector-matrix dimensions, " + std::to_string(matrix.size_row()) + "," +
               std::to_string(matrix.size_column()) + " vs. " + std::to_string(vector.size()));
  typedef typename Static_Promoter<Vector_Dense<_type, _row>, Vector_Dense<_type, _size>>::type _return_vector;
  return _return_vector([&](const std::size_t i_row) { return dot_product(matrix[i_row], vector); },
                        matrix.size_column());
}